

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::ProfileModulus<true>
          (InterpreterStackFrame *this,Var aLeft,Var aRight,ScriptContext *scriptContext,
          ProfileId profileId)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar4;
  Var pvVar5;
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(aLeft);
    uVar3 = TaggedInt::ToInt32(aRight);
    if ((0 < (int)uVar2) && ((uVar3 + 0x7fffffff & uVar3) == 0 && 0 < (int)uVar3)) {
      pDVar4 = FunctionBody::GetDynamicProfileInfo(this_00);
      DynamicProfileInfo::RecordModulusOpType(pDVar4,this_00,profileId,true);
      return (Var)((ulong)(uVar3 + 0x7fffffff & uVar2) | 0x1000000000000);
    }
  }
  pDVar4 = FunctionBody::GetDynamicProfileInfo(this_00);
  DynamicProfileInfo::RecordModulusOpType(pDVar4,this_00,profileId,false);
  pvVar5 = JavascriptMath::Modulus_Full(aLeft,aRight,scriptContext);
  return pvVar5;
}

Assistant:

Var InterpreterStackFrame::ProfileModulus(Var aLeft, Var aRight, ScriptContext* scriptContext, ProfileId profileId)
    {
        // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
        if (doProfile)
        {
            Js::FunctionBody* body = this->function->GetFunctionBody();
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                int nLeft = TaggedInt::ToInt32(aLeft);
                int nRight = TaggedInt::ToInt32(aRight);

                // nLeft is positive and nRight is +2^i
                // Fast path for Power of 2 divisor
                if (nLeft > 0 && ::Math::IsPow2(nRight))
                {
                    body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ true);
                    return TaggedInt::ToVarUnchecked(nLeft & (nRight - 1));
                }
            }
            body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ false);
        }

        return JavascriptMath::Modulus(aLeft, aRight, scriptContext);
    }